

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void __thiscall tetgenmesh::constrainedfacets(tetgenmesh *this)

{
  bool bVar1;
  int iVar2;
  interresult iVar3;
  arraypool *paVar4;
  arraypool *this_00;
  arraypool *this_01;
  arraypool *this_02;
  arraypool *this_03;
  arraypool *this_04;
  arraypool *this_05;
  arraypool *this_06;
  arraypool *this_07;
  arraypool *this_08;
  arraypool *this_09;
  arraypool *this_10;
  arraypool *this_11;
  arraypool *this_12;
  arraypool *this_13;
  face *s;
  point startpt;
  point endpt;
  int local_f8;
  uint local_f4;
  int j;
  int i;
  int t1ver;
  int success;
  int facetcount;
  interresult dir;
  point *parypt;
  face *paryseg;
  face *parysh1;
  face *parysh;
  face searchsh;
  triface crossedge;
  triface neightet;
  triface searchtet;
  arraypool *tg_missingshverts;
  arraypool *tg_missingshbds;
  arraypool *tg_missingshs;
  arraypool *tg_botpoints;
  arraypool *tg_toppoints;
  arraypool *tg_facfaces;
  arraypool *tg_botshells;
  arraypool *tg_topshells;
  arraypool *tg_midfaces;
  arraypool *tg_botfaces;
  arraypool *tg_topfaces;
  arraypool *tg_botnewtets;
  arraypool *tg_topnewtets;
  arraypool *tg_crosstets;
  tetgenmesh *this_local;
  
  triface::triface((triface *)&neightet.ver);
  triface::triface((triface *)&crossedge.ver);
  triface::triface((triface *)&searchsh.shver);
  face::face((face *)&parysh);
  paVar4 = (arraypool *)operator_new(0x30);
  arraypool::arraypool(paVar4,0x10,10);
  this_00 = (arraypool *)operator_new(0x30);
  arraypool::arraypool(this_00,0x10,10);
  this_01 = (arraypool *)operator_new(0x30);
  arraypool::arraypool(this_01,0x10,10);
  this_02 = (arraypool *)operator_new(0x30);
  arraypool::arraypool(this_02,0x10,10);
  this_03 = (arraypool *)operator_new(0x30);
  arraypool::arraypool(this_03,0x10,10);
  this_04 = (arraypool *)operator_new(0x30);
  arraypool::arraypool(this_04,0x10,10);
  this_05 = (arraypool *)operator_new(0x30);
  arraypool::arraypool(this_05,8,8);
  this_06 = (arraypool *)operator_new(0x30);
  arraypool::arraypool(this_06,8,8);
  this_07 = (arraypool *)operator_new(0x30);
  arraypool::arraypool(this_07,0x10,10);
  this_08 = (arraypool *)operator_new(0x30);
  arraypool::arraypool(this_08,0x10,10);
  this_09 = (arraypool *)operator_new(0x30);
  arraypool::arraypool(this_09,0x10,10);
  this_10 = (arraypool *)operator_new(0x30);
  arraypool::arraypool(this_10,0x10,10);
  this_11 = (arraypool *)operator_new(0x30);
  arraypool::arraypool(this_11,0x10,10);
  this_12 = (arraypool *)operator_new(0x30);
  arraypool::arraypool(this_12,8,8);
  this_13 = (arraypool *)operator_new(0x30);
  arraypool::arraypool(this_13,0x10,4);
  this->encseglist = this_13;
  t1ver = 0;
  while (0 < this->subfacstack->objects) {
    this->subfacstack->objects = this->subfacstack->objects + -1;
    parysh1 = (face *)(this->subfacstack->toparray
                       [this->subfacstack->objects >>
                        ((byte)this->subfacstack->log2objectsperblock & 0x3f)] +
                      (this->subfacstack->objects & (long)this->subfacstack->objectsperblockmark) *
                      (long)this->subfacstack->objectbytes);
    face::operator=((face *)&parysh,parysh1);
    if ((*(long *)&parysh[1].shver != 0) &&
       ((&parysh->sh)[(int)(((uint)searchsh.sh & 1) + 9)] == (shellface *)0x0)) {
      smarktest(this,(face *)&parysh);
      arraypool::newindex(this_07,&parysh1);
      face::operator=(parysh1,(face *)&parysh);
      for (local_f4 = 0; (long)(int)local_f4 < this_07->objects; local_f4 = local_f4 + 1) {
        parysh1 = (face *)(this_07->toparray
                           [(int)local_f4 >> ((byte)this_07->log2objectsperblock & 0x1f)] +
                          (int)((local_f4 & this_07->objectsperblockmark) * this_07->objectbytes));
        for (local_f8 = 0; local_f8 < 3; local_f8 = local_f8 + 1) {
          if (parysh1->sh[(parysh1->shver >> 1) + 6] == (shellface)0x0) {
            spivot(this,parysh1,(face *)&parysh);
            bVar1 = smarktested(this,(face *)&parysh);
            if ((!bVar1) && ((&parysh->sh)[(int)(((uint)searchsh.sh & 1) + 9)] == (shellface *)0x0))
            {
              smarktest(this,(face *)&parysh);
              arraypool::newindex(this_07,&paryseg);
              face::operator=(paryseg,(face *)&parysh);
            }
          }
          senextself(this,parysh1);
        }
      }
      for (local_f4 = 0; (long)(int)local_f4 < this_07->objects; local_f4 = local_f4 + 1) {
        parysh1 = (face *)(this_07->toparray
                           [(int)local_f4 >> ((byte)this_07->log2objectsperblock & 0x1f)] +
                          (int)((local_f4 & this_07->objectsperblockmark) * this_07->objectbytes));
        sunmarktest(this,parysh1);
      }
      if (1 < this->b->verbose) {
        printf("    Recovering facet #%d: %ld subfaces.\n",(ulong)(t1ver + 1),this_07->objects);
      }
      t1ver = t1ver + 1;
      while (0 < this_07->objects) {
        this_07->objects = this_07->objects + -1;
        parysh1 = (face *)(this_07->toparray
                           [this_07->objects >> ((byte)this_07->log2objectsperblock & 0x3f)] +
                          (this_07->objects & (long)this_07->objectsperblockmark) *
                          (long)this_07->objectbytes);
        face::operator=((face *)&parysh,parysh1);
        if ((*(long *)&parysh[1].shver != 0) &&
           ((&parysh->sh)[(int)(((uint)searchsh.sh & 1) + 9)] == (shellface *)0x0)) {
          neightet.ver = 0;
          neightet._12_4_ = 0;
          iVar2 = scoutsubface(this,(face *)&parysh,(triface *)&neightet.ver,1);
          if (iVar2 == 0) {
            formregion(this,(face *)&parysh,this_10,this_11,this_12);
            iVar2 = scoutcrossedge(this,(triface *)&neightet.ver,this_11,this_10);
            if (iVar2 == 0) {
              for (local_f4 = 0; (long)(int)local_f4 < this_10->objects; local_f4 = local_f4 + 1) {
                parysh1 = (face *)(this_10->toparray
                                   [(int)local_f4 >> ((byte)this_10->log2objectsperblock & 0x1f)] +
                                  (int)((local_f4 & this_10->objectsperblockmark) *
                                       this_10->objectbytes));
                arraypool::newindex(this_07,&paryseg);
                face::operator=(paryseg,parysh1);
              }
              i = 1;
            }
            else {
              triface::operator=((triface *)&searchsh.shver,(triface *)&neightet.ver);
              bVar1 = formcavity(this,(triface *)&neightet.ver,this_10,paVar4,this_02,this_03,
                                 this_05,this_06);
              i = (int)bVar1;
              if (i != 0) {
                if (this->b->flipinsert == 0) {
                  delaunizecavity(this,this_05,this_02,this_08,this_00,paVar4,this_04);
                  delaunizecavity(this,this_06,this_03,this_09,this_01,paVar4,this_04);
                  bVar1 = fillcavity(this,this_08,this_09,this_04,this_10,this_00,this_01,
                                     (triface *)&searchsh.shver);
                  i = (int)bVar1;
                  if (i == 0) {
                    restorecavity(this,paVar4,this_00,this_01,this_11);
                  }
                  else {
                    carvecavity(this,paVar4,this_00,this_01);
                  }
                }
                else {
                  flipinsertfacet(this,paVar4,this_05,this_06,this_12);
                  for (local_f4 = 0; (long)(int)local_f4 < this_10->objects; local_f4 = local_f4 + 1
                      ) {
                    parysh1 = (face *)(this_10->toparray
                                       [(int)local_f4 >> ((byte)this_10->log2objectsperblock & 0x1f)
                                       ] + (int)((local_f4 & this_10->objectsperblockmark) *
                                                this_10->objectbytes));
                    arraypool::newindex(this_07,&paryseg);
                    face::operator=(paryseg,parysh1);
                  }
                  i = 1;
                  arraypool::restart(paVar4);
                  arraypool::restart(this_02);
                  arraypool::restart(this_03);
                  arraypool::restart(this_05);
                  arraypool::restart(this_06);
                }
                if (i != 0) {
                  for (local_f4 = 0; (long)(int)local_f4 < this->caveencshlist->objects;
                      local_f4 = local_f4 + 1) {
                    parysh1 = (face *)(this->caveencshlist->toparray
                                       [(int)local_f4 >>
                                        ((byte)this->caveencshlist->log2objectsperblock & 0x1f)] +
                                      (int)((local_f4 & this->caveencshlist->objectsperblockmark) *
                                           this->caveencshlist->objectbytes));
                    iVar2 = scoutsubface(this,parysh1,(triface *)&neightet.ver,1);
                    if (iVar2 == 0) {
                      arraypool::newindex(this_07,&paryseg);
                      face::operator=(paryseg,parysh1);
                    }
                  }
                  arraypool::restart(this->caveencshlist);
                  for (local_f4 = 0; (long)(int)local_f4 < this->caveencseglist->objects;
                      local_f4 = local_f4 + 1) {
                    s = (face *)(this->caveencseglist->toparray
                                 [(int)local_f4 >>
                                  ((byte)this->caveencseglist->log2objectsperblock & 0x1f)] +
                                (int)((local_f4 & this->caveencseglist->objectsperblockmark) *
                                     this->caveencseglist->objectbytes));
                    startpt = sorg(this,s);
                    endpt = sdest(this,s);
                    iVar3 = scoutsegment(this,startpt,endpt,s,(triface *)&neightet.ver,(point *)0x0,
                                         (arraypool *)0x0);
                    if (iVar3 != SHAREEDGE) {
                      terminatetetgen(this,2);
                    }
                    sstbond1(this,s,(triface *)&neightet.ver);
                    triface::operator=((triface *)&crossedge.ver,(triface *)&neightet.ver);
                    do {
                      tssbond1(this,(triface *)&crossedge.ver,s);
                      iVar2 = (int)neightet.tet;
                      decode(this,*(tetrahedron *)
                                   (crossedge._8_8_ + (long)facepivot1[(int)neightet.tet] * 8),
                             (triface *)&crossedge.ver);
                      neightet.tet._0_4_ = facepivot2[iVar2][(int)neightet.tet];
                    } while (crossedge._8_8_ != neightet._8_8_);
                  }
                  arraypool::restart(this->caveencseglist);
                }
              }
            }
            for (local_f4 = 0; (long)(int)local_f4 < this_12->objects; local_f4 = local_f4 + 1) {
              punmarktest(this,*(point *)(this_12->toparray
                                          [(int)local_f4 >>
                                           ((byte)this_12->log2objectsperblock & 0x1f)] +
                                         (int)((local_f4 & this_12->objectsperblockmark) *
                                              this_12->objectbytes)));
            }
            arraypool::restart(this_12);
            arraypool::restart(this_11);
            arraypool::restart(this_10);
            if (i == 0) {
              refineregion(this,&this->recentsh,this_05,this_02,this_08,this_00,paVar4,this_04);
            }
          }
        }
      }
    }
  }
  this->totalworkmemory =
       paVar4->totalmemory + this_00->totalmemory + this_01->totalmemory + this_02->totalmemory +
       this_03->totalmemory + this_04->totalmemory + this_05->totalmemory + this_06->totalmemory +
       this_07->totalmemory + this_08->totalmemory + this_09->totalmemory + this_10->totalmemory +
       this_11->totalmemory + this_12->totalmemory + this->encseglist->totalmemory +
       this->totalworkmemory;
  if (paVar4 != (arraypool *)0x0) {
    arraypool::~arraypool(paVar4);
    operator_delete(paVar4,0x30);
  }
  if (this_00 != (arraypool *)0x0) {
    arraypool::~arraypool(this_00);
    operator_delete(this_00,0x30);
  }
  if (this_01 != (arraypool *)0x0) {
    arraypool::~arraypool(this_01);
    operator_delete(this_01,0x30);
  }
  if (this_02 != (arraypool *)0x0) {
    arraypool::~arraypool(this_02);
    operator_delete(this_02,0x30);
  }
  if (this_03 != (arraypool *)0x0) {
    arraypool::~arraypool(this_03);
    operator_delete(this_03,0x30);
  }
  if (this_04 != (arraypool *)0x0) {
    arraypool::~arraypool(this_04);
    operator_delete(this_04,0x30);
  }
  if (this_05 != (arraypool *)0x0) {
    arraypool::~arraypool(this_05);
    operator_delete(this_05,0x30);
  }
  if (this_06 != (arraypool *)0x0) {
    arraypool::~arraypool(this_06);
    operator_delete(this_06,0x30);
  }
  if (this_07 != (arraypool *)0x0) {
    arraypool::~arraypool(this_07);
    operator_delete(this_07,0x30);
  }
  if (this_08 != (arraypool *)0x0) {
    arraypool::~arraypool(this_08);
    operator_delete(this_08,0x30);
  }
  if (this_09 != (arraypool *)0x0) {
    arraypool::~arraypool(this_09);
    operator_delete(this_09,0x30);
  }
  if (this_10 != (arraypool *)0x0) {
    arraypool::~arraypool(this_10);
    operator_delete(this_10,0x30);
  }
  if (this_11 != (arraypool *)0x0) {
    arraypool::~arraypool(this_11);
    operator_delete(this_11,0x30);
  }
  if (this_12 != (arraypool *)0x0) {
    arraypool::~arraypool(this_12);
    operator_delete(this_12,0x30);
  }
  paVar4 = this->encseglist;
  if (paVar4 != (arraypool *)0x0) {
    arraypool::~arraypool(paVar4);
    operator_delete(paVar4,0x30);
  }
  this->encseglist = (arraypool *)0x0;
  return;
}

Assistant:

void tetgenmesh::constrainedfacets()
{
  arraypool *tg_crosstets, *tg_topnewtets, *tg_botnewtets;
  arraypool *tg_topfaces, *tg_botfaces, *tg_midfaces;
  arraypool *tg_topshells, *tg_botshells, *tg_facfaces; 
  arraypool *tg_toppoints, *tg_botpoints;
  arraypool *tg_missingshs, *tg_missingshbds, *tg_missingshverts;
  triface searchtet, neightet, crossedge;
  face searchsh, *parysh, *parysh1;
  face *paryseg;
  point *parypt;
  enum interresult dir;
  int facetcount;
  int success;
  int t1ver;
  int i, j;

  // Initialize arrays.
  tg_crosstets      = new arraypool(sizeof(triface), 10);
  tg_topnewtets     = new arraypool(sizeof(triface), 10);
  tg_botnewtets     = new arraypool(sizeof(triface), 10);
  tg_topfaces       = new arraypool(sizeof(triface), 10);
  tg_botfaces       = new arraypool(sizeof(triface), 10);
  tg_midfaces       = new arraypool(sizeof(triface), 10);
  tg_toppoints      = new arraypool(sizeof(point), 8);
  tg_botpoints      = new arraypool(sizeof(point), 8);
  tg_facfaces       = new arraypool(sizeof(face), 10);
  tg_topshells      = new arraypool(sizeof(face), 10);
  tg_botshells      = new arraypool(sizeof(face), 10);
  tg_missingshs     = new arraypool(sizeof(face), 10);
  tg_missingshbds   = new arraypool(sizeof(face), 10);
  tg_missingshverts = new arraypool(sizeof(point), 8);
  // This is a global array used by refineregion().
  encseglist        = new arraypool(sizeof(face), 4);

  facetcount = 0;

  while (subfacstack->objects > 0l) {

    subfacstack->objects--;
    parysh = (face *) fastlookup(subfacstack, subfacstack->objects);
    searchsh = *parysh;

    if (searchsh.sh[3] == NULL) continue; // It is dead.
    if (isshtet(searchsh)) continue; // It is recovered.

    // Collect all unrecovered subfaces which are co-facet.
    smarktest(searchsh);
    tg_facfaces->newindex((void **) &parysh);
    *parysh = searchsh;
    for (i = 0; i < tg_facfaces->objects; i++) {
      parysh = (face *) fastlookup(tg_facfaces, i);
      for (j = 0; j < 3; j++) {
        if (!isshsubseg(*parysh)) {
          spivot(*parysh, searchsh);
          if (!smarktested(searchsh)) {
            if (!isshtet(searchsh)) {
              smarktest(searchsh);
              tg_facfaces->newindex((void **) &parysh1);
              *parysh1 = searchsh;
            }
          }
        }
        senextself(*parysh);
      } // j
    } // i
    // Have found all facet subfaces. Unmark them.
    for (i = 0; i < tg_facfaces->objects; i++) {
      parysh = (face *) fastlookup(tg_facfaces, i);
      sunmarktest(*parysh);
    }

    if (b->verbose > 1) {
      printf("    Recovering facet #%d: %ld subfaces.\n", facetcount + 1, 
             tg_facfaces->objects);
    }
    facetcount++;

    while (tg_facfaces->objects > 0l) {

      tg_facfaces->objects--;
      parysh = (face *) fastlookup(tg_facfaces, tg_facfaces->objects);
      searchsh = *parysh;

      if (searchsh.sh[3] == NULL) continue; // It is dead.
      if (isshtet(searchsh)) continue; // It is recovered.

      searchtet.tet = NULL;
      if (scoutsubface(&searchsh, &searchtet, 1)) continue;

      // The subface is missing. Form the missing region.
      //   Re-use 'tg_crosstets' for 'adjtets'.
      formregion(&searchsh, tg_missingshs, tg_missingshbds, tg_missingshverts);

      if (scoutcrossedge(searchtet, tg_missingshbds, tg_missingshs)) {
        // Save this crossing edge, will be used by fillcavity().
        crossedge = searchtet;
        // Form a cavity of crossing tets.
        success = formcavity(&searchtet, tg_missingshs, tg_crosstets,
                             tg_topfaces, tg_botfaces, tg_toppoints,
                             tg_botpoints);
        if (success) {
          if (!b->flipinsert) {
            // Tetrahedralize the top part. Re-use 'tg_midfaces'.
            delaunizecavity(tg_toppoints, tg_topfaces, tg_topshells,
                            tg_topnewtets, tg_crosstets, tg_midfaces);
            // Tetrahedralize the bottom part. Re-use 'tg_midfaces'.
            delaunizecavity(tg_botpoints, tg_botfaces, tg_botshells,
                            tg_botnewtets, tg_crosstets, tg_midfaces);
            // Fill the cavity with new tets.
            success = fillcavity(tg_topshells, tg_botshells, tg_midfaces,
                                 tg_missingshs, tg_topnewtets, tg_botnewtets,
                                 &crossedge);
            if (success) {
              // Cavity is remeshed. Delete old tets and outer new tets.
              carvecavity(tg_crosstets, tg_topnewtets, tg_botnewtets);
            } else {
              restorecavity(tg_crosstets, tg_topnewtets, tg_botnewtets,
                            tg_missingshbds);
            }
          } else {
            // Use the flip algorithm of Shewchuk to recover the subfaces.
            flipinsertfacet(tg_crosstets, tg_toppoints, tg_botpoints, 
                            tg_missingshverts);
			// Put all subfaces in R back to tg_facfaces.
		    for (i = 0; i < tg_missingshs->objects; i++) {
		      parysh = (face *) fastlookup(tg_missingshs, i);
		      tg_facfaces->newindex((void **) &parysh1);
              *parysh1 = *parysh;
		    }
			success = 1;
            // Clear working lists.
            tg_crosstets->restart();
            tg_topfaces->restart();
            tg_botfaces->restart();
            tg_toppoints->restart();
            tg_botpoints->restart();
          } // b->flipinsert

          if (success) {
            // Recover interior subfaces.
            for (i = 0; i < caveencshlist->objects; i++) {
              parysh = (face *) fastlookup(caveencshlist, i);
              if (!scoutsubface(parysh, &searchtet, 1)) {
                // Add this face at the end of the list, so it will be
                //   processed immediately.
                tg_facfaces->newindex((void **) &parysh1);
                *parysh1 = *parysh;
              }
            }
            caveencshlist->restart();
            // Recover interior segments. This should always be recovered.
            for (i = 0; i < caveencseglist->objects; i++) {
              paryseg = (face *) fastlookup(caveencseglist, i);
              dir = scoutsegment(sorg(*paryseg), sdest(*paryseg), paryseg,
                                 &searchtet, NULL, NULL);
              if (dir != SHAREEDGE) {
                terminatetetgen(this, 2);
              }
              // Insert this segment.
              // Let the segment remember an adjacent tet.
              sstbond1(*paryseg, searchtet);
              // Bond the segment to all tets containing it.
              neightet = searchtet;
              do {
                tssbond1(neightet, *paryseg);
                fnextself(neightet);
              } while (neightet.tet != searchtet.tet);
            }
            caveencseglist->restart();
          } // success - remesh cavity
        } // success - form cavity
      } else {
        // Put all subfaces in R back to tg_facfaces.
		for (i = 0; i < tg_missingshs->objects; i++) {
		  parysh = (face *) fastlookup(tg_missingshs, i);
		  tg_facfaces->newindex((void **) &parysh1);
          *parysh1 = *parysh;
		}
		success = 1;
      } // if (scoutcrossedge)

      // Unmarktest all points of the missing region.
      for (i = 0; i < tg_missingshverts->objects; i++) {
        parypt = (point *) fastlookup(tg_missingshverts, i);
        punmarktest(*parypt);
      }
      tg_missingshverts->restart();
      tg_missingshbds->restart();
      tg_missingshs->restart();

      if (!success) {
        // The missing region can not be recovered. Refine it.
        refineregion(recentsh, tg_toppoints, tg_topfaces, tg_topshells,
                     tg_topnewtets, tg_crosstets, tg_midfaces);
      }
    } // while (tg_facfaces->objects)

  } // while ((subfacstack->objects)

  // Accumulate the dynamic memory.
  totalworkmemory += (tg_crosstets->totalmemory + tg_topnewtets->totalmemory +
                      tg_botnewtets->totalmemory + tg_topfaces->totalmemory +
                      tg_botfaces->totalmemory + tg_midfaces->totalmemory +
                      tg_toppoints->totalmemory + tg_botpoints->totalmemory +
                      tg_facfaces->totalmemory + tg_topshells->totalmemory +
                      tg_botshells->totalmemory + tg_missingshs->totalmemory +
                      tg_missingshbds->totalmemory + 
                      tg_missingshverts->totalmemory + 
                      encseglist->totalmemory);

  // Delete arrays.
  delete tg_crosstets;
  delete tg_topnewtets;
  delete tg_botnewtets;
  delete tg_topfaces;
  delete tg_botfaces;
  delete tg_midfaces;
  delete tg_toppoints;
  delete tg_botpoints;
  delete tg_facfaces;
  delete tg_topshells;
  delete tg_botshells;
  delete tg_missingshs;
  delete tg_missingshbds;
  delete tg_missingshverts;
  delete encseglist;
  encseglist = NULL;
}